

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_normal
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,FaceHandle _fh,Vec3f *_normal)

{
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_00;
  bool bVar1;
  VectorT<float,_3> *_src;
  return_type local_40;
  BaseHandle local_24;
  OpenMesh *local_20;
  Vec3f *_normal_local;
  ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this_local;
  FaceHandle _fh_local;
  
  local_20 = (OpenMesh *)_normal;
  _normal_local = (Vec3f *)this;
  this_local._4_4_ = _fh.super_BaseHandle.idx_;
  bVar1 = AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
          has_face_normals((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            *)this->mesh_);
  if (bVar1) {
    this_00 = (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *
              )this->mesh_;
    local_24.idx_ = this_local._4_4_;
    vector_cast<OpenMesh::VectorT<double,3>,OpenMesh::VectorT<float,3>>(&local_40,local_20,_src);
    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::set_normal
              (this_00,(FaceHandle)local_24.idx_,&local_40);
  }
  return;
}

Assistant:

virtual void set_normal(FaceHandle _fh, const Vec3f& _normal)
  {
    if (mesh_.has_face_normals())
      mesh_.set_normal(_fh, vector_cast<Normal>(_normal));
  }